

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O2

size_t ans_serialize_interp
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,size_t frame_size,
                 uint8_t **out_u8)

{
  uint8_t *puVar1;
  uint32_t *f;
  pointer puVar2;
  ulong uVar3;
  size_t sVar4;
  uint x;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> increasing_freqs;
  allocator_type local_49;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  auVar6 = in_ZMM0._0_16_;
  x = (int)((ulong)((long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
  vbyte_encode_u32(out_u8,x);
  auVar6 = vcvtusi2sd_avx512f(auVar6,frame_size);
  dVar5 = log2(auVar6._0_8_);
  puVar1 = *out_u8;
  *out_u8 = puVar1 + 1;
  *puVar1 = (uint8_t)(int)dVar5;
  f = (uint32_t *)*out_u8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_49);
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *local_48._M_impl.super__Vector_impl_data._M_start = *puVar2;
  for (uVar3 = 0; x != uVar3; uVar3 = uVar3 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar3 + 1] =
         local_48._M_impl.super__Vector_impl_data._M_start[uVar3] + 1 + puVar2[uVar3 + 1];
  }
  sVar4 = (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  sVar4 = interpolative_internal::encode
                    (f,local_48._M_impl.super__Vector_impl_data._M_start,sVar4,
                     frame_size + 1 + sVar4);
  *out_u8 = *out_u8 + sVar4;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return sVar4;
}

Assistant:

size_t ans_serialize_interp(
    std::vector<uint32_t>& vec, size_t frame_size, uint8_t*& out_u8)
{
    uint32_t max_sym = vec.size() - 1;
    vbyte_encode_u32(out_u8, max_sym);
    *out_u8++ = log2(frame_size); // must be power of 2
    auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
    std::vector<uint32_t> increasing_freqs(vec.size());
    increasing_freqs[0] = vec[0];
    for (size_t sym = 1; sym <= max_sym; sym++) {
        increasing_freqs[sym] = increasing_freqs[sym - 1] + vec[sym] + 1;
    }
    auto in_buf = increasing_freqs.data();
    auto bytes_written = interpolative_internal::encode(
        out_ptr_u32, in_buf, vec.size(), frame_size + vec.size() + 1);
    out_u8 += bytes_written;
    return bytes_written;
}